

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
::init(GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
       *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  int numBytes;
  int numBytes_00;
  int numBytes_01;
  int numBytes_02;
  int numBytes_03;
  int numBytes_04;
  char *local_428;
  char *local_410;
  char *local_408;
  char *local_3e0;
  char *local_3d8;
  deInt32 local_388;
  deInt32 local_384;
  char *local_378;
  char *local_370;
  byte local_364;
  allocator<char> local_363;
  byte local_362;
  byte local_361;
  string local_360;
  byte local_33b;
  byte local_33a;
  byte local_339;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  int local_214;
  int local_210;
  int local_20c;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0 [3];
  MessageBuilder local_1b8;
  uint local_34;
  uint local_30;
  int maxUnrelatedUploadSize;
  int minUnrelatedUploadSize;
  int maxUploadSize;
  int minUploadSize;
  int fullMaxUploadSize;
  int fullMinUploadSize;
  int perVertexSize;
  char *targetFunctionName;
  GenericUploadRenderTimeCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
  *this_local;
  
  targetFunctionName = (char *)this;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
  ::init(&this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
         ,ctx);
  _fullMinUploadSize = "Draw method: drawElements";
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
      ).m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    _fullMinUploadSize = "Draw method: drawArrays";
  }
  _fullMinUploadSize = _fullMinUploadSize + 0xd;
  fullMaxUploadSize = 0x20;
  if (*(int *)&(this->
               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
               ).field_0xcc == 1) {
    fullMaxUploadSize = 4;
  }
  iVar1 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMinWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  minUploadSize = iVar1 * fullMaxUploadSize;
  iVar1 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMaxWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  maxUploadSize = iVar1 * fullMaxUploadSize;
  if (this->m_uploadRange == UPLOADRANGE_FULL) {
    local_384 = minUploadSize;
  }
  else {
    local_384 = deAlign32(minUploadSize / 2,4);
  }
  minUnrelatedUploadSize = local_384;
  if (this->m_uploadRange == UPLOADRANGE_FULL) {
    local_388 = maxUploadSize;
  }
  else {
    local_388 = deAlign32(maxUploadSize / 2,4);
  }
  maxUnrelatedUploadSize = local_388;
  iVar1 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMinWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  local_30 = iVar1 << 5;
  iVar1 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMaxWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  local_34 = iVar1 << 5;
  this_00 = tcu::TestContext::getLog
                      ((this->
                       super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                       ).super_RenderPerformanceTestBase.super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [28])"Measuring the time used in ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char **)&fullMinUploadSize);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [58])
                             " and readPixels call with different rendering workloads.\n");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])"The ");
  local_1d0[0] = "vertex attrib";
  if (*(int *)&(this->
               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
               ).field_0xcc == 1) {
    local_1d0[0] = "index";
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d0);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])0x2b25c9f);
  local_1d8 = "contents ";
  if (this->m_bufferState == BUFFERSTATE_NEW) {
    local_1d8 = "";
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d8);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [34])"sourced by the rendering command ");
  if (this->m_bufferState == BUFFERSTATE_NEW) {
    local_3d8 = "is uploaded ";
  }
  else {
    if (this->m_uploadRange == UPLOADRANGE_FULL) {
      local_3e0 = "are specified ";
    }
    else {
      local_3e0 = (char *)0x0;
      if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
        local_3e0 = "are updated (partial upload) ";
      }
    }
    local_3d8 = local_3e0;
  }
  local_1e0 = local_3d8;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1e0);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [44])"just before issuing the rendering command.\n");
  local_1e8 = "The buffer is generated just before uploading.\n";
  if (this->m_bufferState == BUFFERSTATE_EXISTING) {
    local_1e8 = "The buffer has been used in rendering.\n";
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1e8);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2c35993);
  if (this->m_bufferState == BUFFERSTATE_NEW) {
    local_408 = "is uploaded";
  }
  else {
    if (this->m_uploadRange == UPLOADRANGE_FULL) {
      local_410 = "contents are specified";
    }
    else {
      local_410 = (char *)0x0;
      if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
        local_410 = "contents are partially updated";
      }
    }
    local_408 = local_410;
  }
  local_1f0 = local_408;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1f0);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])0x2b2d7b8);
  if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) {
    local_428 = "bufferData";
  }
  else {
    local_428 = "mapBufferRange";
    if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) {
      local_428 = "bufferSubData";
    }
  }
  local_1f8 = local_428;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1f8);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [55])
                             " command. Usage of the target buffer is DYNAMIC_DRAW.\n");
  local_200 = "";
  if (this->m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE) {
    local_200 = 
    "Mapping buffer with bits MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT | MAP_INVALIDATE_BUFFER_BIT | MAP_UNSYNCHRONIZED_BIT\n"
    ;
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_200);
  local_208 = "";
  if (this->m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) {
    local_208 = 
    "Uploading an unrelated buffer just before issuing the rendering command with bufferData.\n";
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_208);
  local_20c = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
              ::getNumSamples(&this->
                               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                             );
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_20c);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [44])" test samples. Sample order is randomized.\n");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [87])0x2bcefc9);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [123])
                             "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
                     );
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [34])"Workload sizes are in the range [");
  local_210 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
              ::getMinWorkloadSize
                        (&this->
                          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                        );
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_210);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])",  ");
  local_214 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
              ::getMaxWorkloadSize
                        (&this->
                          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                        );
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_214);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])"] vertices ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2bd0931);
  uVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMinWorkloadDataSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_238,(_anonymous_namespace_ *)(ulong)uVar2,numBytes);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_238);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c5c975);
  uVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
          ::getMaxWorkloadDataSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
                    );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_258,(_anonymous_namespace_ *)(ulong)uVar2,numBytes_00);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_258);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [21])"] to be processed).\n");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [32])"Upload sizes are in the range [");
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_278,(_anonymous_namespace_ *)(ulong)(uint)minUnrelatedUploadSize,numBytes_01);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_278);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c5c975);
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_298,(_anonymous_namespace_ *)(ulong)(uint)maxUnrelatedUploadSize,numBytes_02);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_298);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])0x2a612bf);
  local_339 = 0;
  local_33a = 0;
  local_33b = 0;
  local_361 = 0;
  local_362 = 0;
  local_364 = 0;
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
      ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
              (&local_338,(_anonymous_namespace_ *)(ulong)local_30,numBytes_03);
    local_339 = 1;
    std::operator+(&local_318,"Unrelated upload sizes are in the range [",&local_338);
    local_33a = 1;
    std::operator+(&local_2f8,&local_318,", ");
    local_33b = 1;
    Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
              (&local_360,(_anonymous_namespace_ *)(ulong)local_34,numBytes_04);
    local_361 = 1;
    std::operator+(&local_2d8,&local_2f8,&local_360);
    local_362 = 1;
    std::operator+(&local_2b8,&local_2d8,"]\n");
  }
  else {
    std::allocator<char>::allocator();
    local_364 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"",&local_363);
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_2b8);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [61])
                             "Test result is the approximated processing rate in MiB / s.\n");
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [88])
                             "Note that while upload time is measured, the time used is not included in the results.\n"
                     );
  local_370 = "";
  if (this->m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) {
    local_370 = 
    "Note that the data size and the time used in the unrelated upload is not included in the results.\n"
    ;
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_370);
  local_378 = "";
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>
      ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    local_378 = "Note that index array size is not included in the processed size.\n";
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_378);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [147])
                             "Note! Test result may not be useful as is but instead should be compared against the reference.* group and other upload_and_draw.* group results.\n"
                     );
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_2b8);
  if ((local_364 & 1) != 0) {
    std::allocator<char>::~allocator(&local_363);
  }
  if ((local_362 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  if ((local_361 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((local_33b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_2f8);
  }
  if ((local_33a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_318);
  }
  if ((local_339 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_338);
  }
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  return extraout_EAX;
}

Assistant:

void GenericUploadRenderTimeCase<SampleType>::init (void)
{
	// init parent
	RenderCase<SampleType>::init();

	// log
	{
		const char* const	targetFunctionName		= (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements");
		const int			perVertexSize			= (m_targetBuffer == TARGETBUFFER_INDEX) ? ((int)sizeof(deUint32)) : ((int)sizeof(tcu::Vec4[2]));
		const int			fullMinUploadSize		= RenderCase<SampleType>::getMinWorkloadSize() * perVertexSize;
		const int			fullMaxUploadSize		= RenderCase<SampleType>::getMaxWorkloadSize() * perVertexSize;
		const int			minUploadSize			= (m_uploadRange == UPLOADRANGE_FULL) ? (fullMinUploadSize) : (deAlign32(fullMinUploadSize/2, 4));
		const int			maxUploadSize			= (m_uploadRange == UPLOADRANGE_FULL) ? (fullMaxUploadSize) : (deAlign32(fullMaxUploadSize/2, 4));
		const int			minUnrelatedUploadSize	= RenderCase<SampleType>::getMinWorkloadSize() * (int)sizeof(tcu::Vec4[2]);
		const int			maxUnrelatedUploadSize	= RenderCase<SampleType>::getMaxWorkloadSize() * (int)sizeof(tcu::Vec4[2]);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Measuring the time used in " << targetFunctionName << " and readPixels call with different rendering workloads.\n"
			<< "The "
				<< ((m_targetBuffer == TARGETBUFFER_INDEX) ? ("index") : ("vertex attrib"))
				<< " buffer "
				<< ((m_bufferState == BUFFERSTATE_NEW) ? ("") : ("contents "))
				<< "sourced by the rendering command "
				<< ((m_bufferState == BUFFERSTATE_NEW)		? ("is uploaded ") :
					(m_uploadRange == UPLOADRANGE_FULL)		? ("are specified ") :
					(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("are updated (partial upload) ") :
					((const char*)DE_NULL))
				<< "just before issuing the rendering command.\n"
			<< ((m_bufferState == BUFFERSTATE_EXISTING) ? ("The buffer has been used in rendering.\n") : ("The buffer is generated just before uploading.\n"))
			<< "Buffer "
				<< ((m_bufferState == BUFFERSTATE_NEW)		? ("is uploaded") :
					(m_uploadRange == UPLOADRANGE_FULL)		? ("contents are specified") :
					(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("contents are partially updated") :
					((const char*)DE_NULL))
				<< " with "
				<< ((m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) ? ("bufferData") : (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) ? ("bufferSubData") : ("mapBufferRange"))
				<< " command. Usage of the target buffer is DYNAMIC_DRAW.\n"
			<< ((m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE) ? ("Mapping buffer with bits MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT | MAP_INVALIDATE_BUFFER_BIT | MAP_UNSYNCHRONIZED_BIT\n") : (""))
			<< ((m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) ? ("Uploading an unrelated buffer just before issuing the rendering command with bufferData.\n") : (""))
			<< RenderCase<SampleType>::getNumSamples() << " test samples. Sample order is randomized.\n"
			<< "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
			<< "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
			<< "Workload sizes are in the range ["
				<< RenderCase<SampleType>::getMinWorkloadSize() << ",  "
				<< RenderCase<SampleType>::getMaxWorkloadSize() << "] vertices "
				<< "(["
				<< getHumanReadableByteSize(RenderCase<SampleType>::getMinWorkloadDataSize()) << ","
				<< getHumanReadableByteSize(RenderCase<SampleType>::getMaxWorkloadDataSize()) << "] to be processed).\n"
			<< "Upload sizes are in the range ["
				<< getHumanReadableByteSize(minUploadSize) << ","
				<< getHumanReadableByteSize(maxUploadSize) << "].\n"
			<< ((m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) ?
				("Unrelated upload sizes are in the range [" + getHumanReadableByteSize(minUnrelatedUploadSize) + ", " + getHumanReadableByteSize(maxUnrelatedUploadSize) + "]\n") :
				(""))
			<< "Test result is the approximated processing rate in MiB / s.\n"
			<< "Note that while upload time is measured, the time used is not included in the results.\n"
			<< ((m_unrelatedBufferType == UNRELATEDBUFFERTYPE_VERTEX) ? ("Note that the data size and the time used in the unrelated upload is not included in the results.\n") : (""))
			<< ((m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) ? ("Note that index array size is not included in the processed size.\n") : (""))
			<< "Note! Test result may not be useful as is but instead should be compared against the reference.* group and other upload_and_draw.* group results.\n"
			<< tcu::TestLog::EndMessage;
	}
}